

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O3

Vector3d *
RigidBodyDynamics::CalcBodyToBaseCoordinates
          (Vector3d *__return_storage_ptr__,Model *model,VectorNd *Q,uint body_id,
          Vector3d *point_body_coordinates,bool update_kinematics)

{
  uint uVar1;
  pointer pSVar2;
  pointer pFVar3;
  uint uVar4;
  undefined7 in_register_00000089;
  Vector3d parent_body_position;
  Vector3d fixed_position;
  Vector3d body_position;
  Matrix3d parent_body_rotation;
  Matrix3d body_rotation;
  undefined8 local_128;
  double dStack_120;
  double local_118;
  undefined8 local_108;
  double dStack_100;
  double local_f8;
  undefined1 *local_e8;
  undefined1 ***pppuStack_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  Vector3d *local_c8;
  undefined1 **local_b0;
  undefined8 *local_a8;
  Vector3d *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar4 = body_id - model->fixed_body_discriminator;
  if (body_id < model->fixed_body_discriminator) {
    pSVar2 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = *(undefined8 *)&pSVar2[body_id].E.super_Matrix3d;
    local_a8 = &local_68;
    local_60 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x18);
    local_58 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x30);
    local_50 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 8);
    local_48 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x20);
    local_40 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x38);
    local_38 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x10);
    local_30 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x28);
    local_28 = *(double *)((long)&pSVar2[body_id].E.super_Matrix3d + 0x40);
    local_d8 = *(undefined8 **)((long)&pSVar2[body_id].r.super_Vector3d + 0x10);
    local_b0 = &local_e8;
    local_e8 = *(undefined1 **)
                &pSVar2[body_id].r.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    pppuStack_e0 = *(undefined1 ****)
                    ((long)&pSVar2[body_id].r.super_Vector3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_a0 = point_body_coordinates;
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                *)&local_b0);
  }
  else {
    pFVar3 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = pFVar3[uVar4].mMovableParent;
    local_68 = *(undefined8 *)&pFVar3[uVar4].mParentTransform.E;
    local_d0 = &local_68;
    local_60 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x18);
    local_58 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x30);
    local_50 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 8);
    local_48 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x20);
    local_40 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x38);
    local_38 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x10);
    local_30 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x28);
    local_28 = *(double *)((long)&pFVar3[uVar4].mParentTransform.E + 0x40);
    local_f8 = *(double *)((long)&pFVar3[uVar4].mParentTransform.r + 0x10);
    local_d8 = &local_108;
    local_108 = *(undefined8 *)&pFVar3[uVar4].mParentTransform.r.super_Vector3d;
    dStack_100 = *(double *)((long)&pFVar3[uVar4].mParentTransform.r + 8);
    pSVar2 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = *(undefined1 ***)&pSVar2[uVar1].E.super_Matrix3d;
    pppuStack_e0 = &local_b0;
    local_a8 = *(undefined8 **)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x18);
    local_a0 = *(Vector3d **)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x30);
    local_98 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 8);
    local_90 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x20);
    local_88 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x38);
    local_80 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x10);
    local_78 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x28);
    local_70 = *(double *)((long)&pSVar2[uVar1].E.super_Matrix3d + 0x40);
    local_118 = *(double *)((long)&pSVar2[uVar1].r.super_Vector3d + 0x10);
    local_128 = *(undefined8 *)
                 &pSVar2[uVar1].r.super_Vector3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    dStack_120 = *(double *)
                  ((long)&pSVar2[uVar1].r.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
    local_e8 = (undefined1 *)&local_128;
    local_c8 = point_body_coordinates;
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,0>const>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>_>
                *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
Vector3d CalcBodyToBaseCoordinates (
		Model &model,
		const VectorNd &Q,
		unsigned int body_id,
		const Vector3d &point_body_coordinates,
		bool update_kinematics) {
	// update the Kinematics if necessary
	if (update_kinematics) {
		UpdateKinematicsCustom (model, &Q, NULL, NULL);
	}

	if (body_id >= model.fixed_body_discriminator) {
		unsigned int fbody_id = body_id - model.fixed_body_discriminator;
		unsigned int parent_id = model.mFixedBodies[fbody_id].mMovableParent;

		Matrix3d fixed_rotation = model.mFixedBodies[fbody_id].mParentTransform.E.transpose();
		Vector3d fixed_position = model.mFixedBodies[fbody_id].mParentTransform.r;

		Matrix3d parent_body_rotation = model.X_base[parent_id].E.transpose();
		Vector3d parent_body_position = model.X_base[parent_id].r;
		return parent_body_position + parent_body_rotation * (fixed_position + fixed_rotation * (point_body_coordinates));
	}

	Matrix3d body_rotation = model.X_base[body_id].E.transpose();
	Vector3d body_position = model.X_base[body_id].r;

	return body_position + body_rotation * point_body_coordinates;
}